

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btQuantizedBvh.cpp
# Opt level: O1

void __thiscall
btQuantizedBvh::walkRecursiveQuantizedTreeAgainstQueryAabb
          (btQuantizedBvh *this,btQuantizedBvhNode *currentNode,btNodeOverlapCallback *nodeCallback,
          unsigned_short *quantizedQueryAabbMin,unsigned_short *quantizedQueryAabbMax)

{
  btQuantizedBvhNode *pbVar1;
  uint uVar2;
  btQuantizedBvhNode *pbVar3;
  
  while ((((*quantizedQueryAabbMin <= currentNode->m_quantizedAabbMax[0] &&
           (currentNode->m_quantizedAabbMin[0] <= *quantizedQueryAabbMax)) &&
          (quantizedQueryAabbMin[2] <= currentNode->m_quantizedAabbMax[2])) &&
         (((currentNode->m_quantizedAabbMin[2] <= quantizedQueryAabbMax[2] &&
           (quantizedQueryAabbMin[1] <= currentNode->m_quantizedAabbMax[1])) &&
          (currentNode->m_quantizedAabbMin[1] <= quantizedQueryAabbMax[1]))))) {
    uVar2 = currentNode->m_escapeIndexOrTriangleIndex;
    if (-1 < (int)uVar2) {
      (*nodeCallback->_vptr_btNodeOverlapCallback[2])
                (nodeCallback,(ulong)(uVar2 >> 0x15),(ulong)(uVar2 & 0x1fffff));
      return;
    }
    walkRecursiveQuantizedTreeAgainstQueryAabb
              (this,currentNode + 1,nodeCallback,quantizedQueryAabbMin,quantizedQueryAabbMax);
    pbVar3 = currentNode + 1;
    pbVar1 = currentNode + 2;
    currentNode = currentNode + (1 - (long)pbVar3->m_escapeIndexOrTriangleIndex);
    if (-1 < (long)pbVar3->m_escapeIndexOrTriangleIndex) {
      currentNode = pbVar1;
    }
  }
  return;
}

Assistant:

void btQuantizedBvh::walkRecursiveQuantizedTreeAgainstQueryAabb(const btQuantizedBvhNode* currentNode,btNodeOverlapCallback* nodeCallback,unsigned short int* quantizedQueryAabbMin,unsigned short int* quantizedQueryAabbMax) const
{
	btAssert(m_useQuantization);
	
	bool isLeafNode;
	//PCK: unsigned instead of bool
	unsigned aabbOverlap;

	//PCK: unsigned instead of bool
	aabbOverlap = testQuantizedAabbAgainstQuantizedAabb(quantizedQueryAabbMin,quantizedQueryAabbMax,currentNode->m_quantizedAabbMin,currentNode->m_quantizedAabbMax);
	isLeafNode = currentNode->isLeafNode();
		
	//PCK: unsigned instead of bool
	if (aabbOverlap != 0)
	{
		if (isLeafNode)
		{
			nodeCallback->processNode(currentNode->getPartId(),currentNode->getTriangleIndex());
		} else
		{
			//process left and right children
			const btQuantizedBvhNode* leftChildNode = currentNode+1;
			walkRecursiveQuantizedTreeAgainstQueryAabb(leftChildNode,nodeCallback,quantizedQueryAabbMin,quantizedQueryAabbMax);

			const btQuantizedBvhNode* rightChildNode = leftChildNode->isLeafNode() ? leftChildNode+1:leftChildNode+leftChildNode->getEscapeIndex();
			walkRecursiveQuantizedTreeAgainstQueryAabb(rightChildNode,nodeCallback,quantizedQueryAabbMin,quantizedQueryAabbMax);
		}
	}		
}